

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

char * __thiscall cmTarget::GetProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  char cVar1;
  pointer pcVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  __type _Var6;
  TargetType TVar7;
  PolicyStatus PVar8;
  int iVar9;
  char *pcVar10;
  size_type sVar11;
  cmTargetInternals *pcVar12;
  size_type sVar13;
  cmSourceFile *this_00;
  cmSourceFileLocation *pcVar14;
  ostream *poVar15;
  cmState *this_01;
  pointer ppTVar16;
  PolicyID id;
  pointer pcVar17;
  pointer input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string entry;
  string local_3c0;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390 [22];
  string objLibName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  ostringstream e_1;
  size_type local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  TVar7 = this->TargetTypeValue;
  if (TVar7 == INTERFACE_LIBRARY) {
    bVar5 = whiteListedInterfaceProperty(prop);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar15 = std::operator<<((ostream *)&e,
                                "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \""
                               );
      poVar15 = std::operator<<(poVar15,(string *)prop);
      std::operator<<(poVar15,"\" is not allowed.");
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(context,FATAL_ERROR,(string *)&e_1);
      std::__cxx11::string::~string((string *)&e_1);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return (char *)0x0;
    }
    TVar7 = this->TargetTypeValue;
  }
  if ((TVar7 < (UNKNOWN_LIBRARY|STATIC_LIBRARY)) && ((0x10fU >> (TVar7 & 0x1f) & 1) != 0)) {
    if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_ == '\0') &&
       (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                     propLOCATION_abi_cxx11_), iVar9 != 0)) {
      std::__cxx11::string::string
                ((string *)
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
                 "LOCATION",(allocator *)&e);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                           propLOCATION_abi_cxx11_);
    }
    _Var6 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propLOCATION_abi_cxx11_);
    if (_Var6) {
      bVar5 = HandleLocationPropertyPolicy(this,context);
      if (!bVar5) {
        return (char *)0x0;
      }
      pcVar10 = GetLocationForBuild(this);
      cmPropertyMap::SetProperty
                (&this->Properties,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
                 pcVar10);
    }
    else {
      std::__cxx11::string::string((string *)&local_50,(string *)prop);
      bVar5 = cmHasLiteralPrefix<std::__cxx11::string,10ul>(&local_50,(char (*) [10])0x48cd18);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar5) {
        bVar5 = HandleLocationPropertyPolicy(this,context);
        if (!bVar5) {
          return (char *)0x0;
        }
        std::__cxx11::string::string((string *)&e,(prop->_M_dataplus)._M_p + 9,(allocator *)&e_1);
        pcVar10 = GetLocation(this,(string *)&e);
        cmPropertyMap::SetProperty(&this->Properties,prop,pcVar10);
      }
      else {
        std::__cxx11::string::string((string *)&local_208,(string *)prop);
        bVar5 = cmHasLiteralSuffix<std::__cxx11::string,10ul>(&local_208,(char (*) [10])0x479c38);
        std::__cxx11::string::~string((string *)&local_208);
        if (!bVar5) goto LAB_003866dd;
        pcVar2 = (prop->_M_dataplus)._M_p;
        _e = (pointer)local_390;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&e,pcVar2,pcVar2 + (prop->_M_string_length - 9));
        bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&e,"IMPORTED");
        if (bVar5) {
          bVar5 = HandleLocationPropertyPolicy(this,context);
          if (!bVar5) {
            std::__cxx11::string::~string((string *)&e);
            return (char *)0x0;
          }
          pcVar10 = GetLocation(this,(string *)&e);
          cmPropertyMap::SetProperty(&this->Properties,prop,pcVar10);
        }
      }
      std::__cxx11::string::~string((string *)&e);
    }
  }
LAB_003866dd:
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   specialProps_abi_cxx11_), iVar9 != 0)) {
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::hash_set(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_);
    __cxa_atexit(cmsys::
                 hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                 ::~hash_set,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         specialProps_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLINK_LIBRARIES_abi_cxx11_ == '\0')
     && (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                      propLINK_LIBRARIES_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLINK_LIBRARIES_abi_cxx11_,
               "LINK_LIBRARIES",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propLINK_LIBRARIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propLINK_LIBRARIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propTYPE_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_,
               "TYPE",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propINCLUDE_DIRECTORIES_abi_cxx11_ ==
       '\0') &&
     (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propINCLUDE_DIRECTORIES_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propINCLUDE_DIRECTORIES_abi_cxx11_,"INCLUDE_DIRECTORIES",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propINCLUDE_DIRECTORIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_FEATURES_abi_cxx11_ == '\0'
      ) && (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         propCOMPILE_FEATURES_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propCOMPILE_FEATURES_abi_cxx11_,"COMPILE_FEATURES",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_FEATURES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_FEATURES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_OPTIONS_abi_cxx11_ == '\0')
     && (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                      propCOMPILE_OPTIONS_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_OPTIONS_abi_cxx11_
               ,"COMPILE_OPTIONS",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_OPTIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_OPTIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_DEFINITIONS_abi_cxx11_ ==
       '\0') &&
     (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propCOMPILE_DEFINITIONS_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propCOMPILE_DEFINITIONS_abi_cxx11_,"COMPILE_DEFINITIONS",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_DEFINITIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_DEFINITIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propIMPORTED_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_,
               "IMPORTED",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propIMPORTED_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propNAME_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_,
               "NAME",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propSOURCES_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_,
               "SOURCES",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propSOURCES_abi_cxx11_);
  }
  if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
      _M_num_elements == 0) {
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLINK_LIBRARIES_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
              propINCLUDE_DIRECTORIES_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_FEATURES_abi_cxx11_)
    ;
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_OPTIONS_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
              propCOMPILE_DEFINITIONS_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_);
  }
  sVar11 = cmsys::
           hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           ::count(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_.
                    _M_ht,prop);
  if (sVar11 != 0) {
    _Var6 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propLINK_LIBRARIES_abi_cxx11_);
    if (_Var6) {
      pcVar12 = (this->Internal).Pointer;
      if ((pcVar12->LinkImplementationPropertyEntries).
          super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pcVar12->LinkImplementationPropertyEntries).
          super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
           (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         output_abi_cxx11_), iVar9 != 0)) {
          GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus._M_p =
               (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                         field_2;
          GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_string_length =
               0;
          GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.field_2.
          _M_local_buf[0] = '\0';
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                               output_abi_cxx11_);
        }
        std::__cxx11::string::assign
                  ((char *)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_)
        ;
        _e = (pointer)local_390;
        local_390[0]._M_local_buf[0] = '\0';
        pcVar12 = (this->Internal).Pointer;
        pcVar3 = (pcVar12->LinkImplementationPropertyEntries).
                 super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pcVar17 = (pcVar12->LinkImplementationPropertyEntries).
                       super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            _Var4._M_p = GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                         _M_dataplus._M_p, pcVar17 != pcVar3; pcVar17 = pcVar17 + 1) {
          std::__cxx11::string::append
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_);
          std::__cxx11::string::append
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_);
          std::__cxx11::string::assign((char *)&e);
        }
        std::__cxx11::string::~string((string *)&e);
        return _Var4._M_p;
      }
    }
    else {
      _Var6 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                    propTYPE_abi_cxx11_);
      if (_Var6) {
        pcVar10 = GetTargetTypeName(this->TargetTypeValue);
        return pcVar10;
      }
      _Var6 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                    propINCLUDE_DIRECTORIES_abi_cxx11_);
      if (_Var6) {
        pcVar12 = (this->Internal).Pointer;
        if ((pcVar12->IncludeDirectoriesEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pcVar12->IncludeDirectoriesEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
             (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                           output_abi_cxx11_), iVar9 != 0)) {
            GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus._M_p
                 = (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_
                             .field_2;
            GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_string_length
                 = 0;
            GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.field_2.
            _M_local_buf[0] = '\0';
            __cxa_atexit(std::__cxx11::string::~string,
                         &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                         &__dso_handle);
            __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                 output_abi_cxx11_);
          }
          MakePropertyList(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                           &((this->Internal).Pointer)->IncludeDirectoriesEntries);
          return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus
                 ._M_p;
        }
      }
      else {
        _Var6 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                      propCOMPILE_FEATURES_abi_cxx11_);
        if (_Var6) {
          pcVar12 = (this->Internal).Pointer;
          if ((pcVar12->CompileFeaturesEntries).
              super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pcVar12->CompileFeaturesEntries).
              super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
               (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                             output_abi_cxx11_), iVar9 != 0)) {
              GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus.
              _M_p = (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                               output_abi_cxx11_.field_2;
              GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
              _M_string_length = 0;
              GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.field_2.
              _M_local_buf[0] = '\0';
              __cxa_atexit(std::__cxx11::string::~string,
                           &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                           &__dso_handle);
              __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   output_abi_cxx11_);
            }
            MakePropertyList(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                              output_abi_cxx11_,&((this->Internal).Pointer)->CompileFeaturesEntries)
            ;
            return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                   _M_dataplus._M_p;
          }
        }
        else {
          _Var6 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                        propCOMPILE_OPTIONS_abi_cxx11_);
          if (_Var6) {
            pcVar12 = (this->Internal).Pointer;
            if ((pcVar12->CompileOptionsEntries).
                super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pcVar12->CompileOptionsEntries).
                super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0')
                 && (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)
                                                  ::output_abi_cxx11_), iVar9 != 0)) {
                GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus.
                _M_p = (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                 output_abi_cxx11_.field_2;
                GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                _M_string_length = 0;
                GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.field_2.
                _M_local_buf[0] = '\0';
                __cxa_atexit(std::__cxx11::string::~string,
                             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                              output_abi_cxx11_,&__dso_handle);
                __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                     output_abi_cxx11_);
              }
              MakePropertyList(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                output_abi_cxx11_,&((this->Internal).Pointer)->CompileOptionsEntries
                              );
              return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                     _M_dataplus._M_p;
            }
          }
          else {
            _Var6 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                          propCOMPILE_DEFINITIONS_abi_cxx11_);
            if (!_Var6) {
              _Var6 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                            propIMPORTED_abi_cxx11_);
              if (_Var6) {
                if (this->IsImportedTarget != false) {
                  return "TRUE";
                }
                return "FALSE";
              }
              _Var6 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                            propNAME_abi_cxx11_);
              if (_Var6) {
                return (this->Name)._M_dataplus._M_p;
              }
              _Var6 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                            propSOURCES_abi_cxx11_);
              if (_Var6) {
                pcVar12 = (this->Internal).Pointer;
                if ((pcVar12->SourceEntries).
                    super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    (pcVar12->SourceEntries).
                    super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  return (char *)0x0;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                pcVar12 = (this->Internal).Pointer;
                pcVar10 = "";
                for (ppTVar16 = (pcVar12->SourceEntries).
                                super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    ppTVar16 !=
                    (pcVar12->SourceEntries).
                    super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish; ppTVar16 = ppTVar16 + 1) {
                  std::__cxx11::string::string
                            ((string *)&entry,(string *)&(((*ppTVar16)->ge).x_)->Input);
                  files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  cmSystemTools::ExpandListArgument(&entry,&files,false);
                  for (input = files.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      input != files.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish; input = input + 1) {
                    std::__cxx11::string::string((string *)&local_1e8,(string *)input);
                    bVar5 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                                      (&local_1e8,(char (*) [18])"$<TARGET_OBJECTS:");
                    if (bVar5) {
                      cVar1 = (input->_M_dataplus)._M_p[input->_M_string_length - 1];
                      std::__cxx11::string::~string((string *)&local_1e8);
                      if (cVar1 != '>') goto LAB_00386c7b;
                      std::__cxx11::string::substr((ulong)&objLibName,(ulong)input);
                      sVar13 = cmGeneratorExpression::Find(&objLibName);
                      if (sVar13 == 0xffffffffffffffff) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e_1);
                        PVar8 = cmMakefile::GetPolicyStatus(context,CMP0051);
                        if (PVar8 - NEW < 3) {
                          std::operator<<((ostream *)&e,pcVar10);
                          std::operator<<((ostream *)&e,(string *)input);
                          pcVar10 = ";";
                        }
                        else if (PVar8 == WARN) {
                          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_3c0,(cmPolicies *)0x33,id);
                          poVar15 = std::operator<<((ostream *)&e_1,(string *)&local_3c0);
                          std::operator<<(poVar15,"\n");
                          std::__cxx11::string::~string((string *)&local_3c0);
                          poVar15 = std::operator<<((ostream *)&e_1,"Target \"");
                          poVar15 = std::operator<<(poVar15,(string *)&this->Name);
                          std::operator<<(poVar15,
                                          "\" contains $<TARGET_OBJECTS> generator expression in its sources list.  This content was not previously part of the SOURCES property when that property was read at configure time.  Code reading that property needs to be adapted to ignore the generator expression using the string(GENEX_STRIP) command."
                                         );
                          std::__cxx11::stringbuf::str();
                          cmMakefile::IssueMessage(context,AUTHOR_WARNING,&local_3c0);
                          std::__cxx11::string::~string((string *)&local_3c0);
                        }
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e_1);
                      }
                      else {
                        std::operator<<((ostream *)&e,pcVar10);
                        std::operator<<((ostream *)&e,(string *)input);
                        pcVar10 = ";";
                      }
                      std::__cxx11::string::~string((string *)&objLibName);
                    }
                    else {
                      std::__cxx11::string::~string((string *)&local_1e8);
LAB_00386c7b:
                      sVar13 = cmGeneratorExpression::Find(input);
                      if (sVar13 == 0xffffffffffffffff) {
                        std::operator<<((ostream *)&e,pcVar10);
                        std::operator<<((ostream *)&e,(string *)input);
                        pcVar10 = ";";
                      }
                      else {
                        this_00 = cmMakefile::GetOrCreateSource(this->Makefile,input,false);
                        pcVar14 = cmSourceFile::GetLocation(this_00);
                        std::__cxx11::string::string((string *)&e_1,(string *)&pcVar14->Directory);
                        if (local_1c0 != 0) {
                          std::__cxx11::string::append((char *)&e_1);
                        }
                        std::__cxx11::string::append((string *)&e_1);
                        std::operator<<((ostream *)&e,pcVar10);
                        std::operator<<((ostream *)&e,(string *)&e_1);
                        std::__cxx11::string::~string((string *)&e_1);
                        pcVar10 = ";";
                      }
                    }
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&files);
                  std::__cxx11::string::~string((string *)&entry);
                  pcVar12 = (this->Internal).Pointer;
                }
                std::__cxx11::string::string((string *)&e_1,"SOURCES",(allocator *)&objLibName);
                std::__cxx11::stringbuf::str();
                cmPropertyMap::SetProperty(&this->Properties,(string *)&e_1,entry._M_dataplus._M_p);
                std::__cxx11::string::~string((string *)&entry);
                std::__cxx11::string::~string((string *)&e_1);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
              }
              goto LAB_00386ee3;
            }
            pcVar12 = (this->Internal).Pointer;
            if ((pcVar12->CompileDefinitionsEntries).
                super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pcVar12->CompileDefinitionsEntries).
                super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0')
                 && (iVar9 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)
                                                  ::output_abi_cxx11_), iVar9 != 0)) {
                GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus.
                _M_p = (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                 output_abi_cxx11_.field_2;
                GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                _M_string_length = 0;
                GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.field_2.
                _M_local_buf[0] = '\0';
                __cxa_atexit(std::__cxx11::string::~string,
                             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                              output_abi_cxx11_,&__dso_handle);
                __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                     output_abi_cxx11_);
              }
              MakePropertyList(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                output_abi_cxx11_,
                               &((this->Internal).Pointer)->CompileDefinitionsEntries);
              return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                     _M_dataplus._M_p;
            }
          }
        }
      }
    }
    return (char *)0x0;
  }
LAB_00386ee3:
  pcVar10 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
  if (pcVar10 != (char *)0x0) {
    return pcVar10;
  }
  this_01 = cmMakefile::GetState(this->Makefile);
  bVar5 = cmState::IsPropertyChained(this_01,prop,TARGET);
  if (bVar5) {
    pcVar10 = cmMakefile::GetProperty(this->Makefile,prop,true);
    return pcVar10;
  }
  return (char *)0x0;
}

Assistant:

const char *cmTarget::GetProperty(const std::string& prop,
                                  cmMakefile* context) const
{
  if (this->GetType() == INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    context->IssueMessage(cmake::FATAL_ERROR, e.str());
    return 0;
    }

  // Watch for special "computed" properties that are dependent on
  // other properties or variables.  Always recompute them.
  if(this->GetType() == cmTarget::EXECUTABLE ||
     this->GetType() == cmTarget::STATIC_LIBRARY ||
     this->GetType() == cmTarget::SHARED_LIBRARY ||
     this->GetType() == cmTarget::MODULE_LIBRARY ||
     this->GetType() == cmTarget::UNKNOWN_LIBRARY)
    {
    static const std::string propLOCATION = "LOCATION";
    if(prop == propLOCATION)
      {
      if (!this->HandleLocationPropertyPolicy(context))
        {
        return 0;
        }

      // Set the LOCATION property of the target.
      //
      // For an imported target this is the location of an arbitrary
      // available configuration.
      //
      // For a non-imported target this is deprecated because it
      // cannot take into account the per-configuration name of the
      // target because the configuration type may not be known at
      // CMake time.
      this->Properties.SetProperty(propLOCATION, this->GetLocationForBuild());
      }

    // Support "LOCATION_<CONFIG>".
    else if(cmHasLiteralPrefix(prop, "LOCATION_"))
      {
      if (!this->HandleLocationPropertyPolicy(context))
        {
        return 0;
        }
      const char* configName = prop.c_str() + 9;
      this->Properties.SetProperty(prop, this->GetLocation(configName));
      }
    // Support "<CONFIG>_LOCATION".
    else if(cmHasLiteralSuffix(prop, "_LOCATION"))
      {
      std::string configName(prop.c_str(), prop.size() - 9);
      if(configName != "IMPORTED")
        {
        if (!this->HandleLocationPropertyPolicy(context))
          {
          return 0;
          }
        this->Properties.SetProperty(prop, this->GetLocation(configName));
        }
      }
    }
  static UNORDERED_SET<std::string> specialProps;
#define MAKE_STATIC_PROP(PROP) \
  static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(TYPE);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(IMPORTED);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(SOURCES);
#undef MAKE_STATIC_PROP
  if(specialProps.empty())
    {
    specialProps.insert(propLINK_LIBRARIES);
    specialProps.insert(propTYPE);
    specialProps.insert(propINCLUDE_DIRECTORIES);
    specialProps.insert(propCOMPILE_FEATURES);
    specialProps.insert(propCOMPILE_OPTIONS);
    specialProps.insert(propCOMPILE_DEFINITIONS);
    specialProps.insert(propIMPORTED);
    specialProps.insert(propNAME);
    specialProps.insert(propSOURCES);
    }
  if(specialProps.count(prop))
    {
    if(prop == propLINK_LIBRARIES)
      {
      if (this->Internal->LinkImplementationPropertyEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = "";
      std::string sep;
      for (std::vector<cmValueWithOrigin>::const_iterator
          it = this->Internal->LinkImplementationPropertyEntries.begin(),
          end = this->Internal->LinkImplementationPropertyEntries.end();
          it != end; ++it)
        {
        output += sep;
        output += it->Value;
        sep = ";";
        }
      return output.c_str();
      }
    // the type property returns what type the target is
    else if (prop == propTYPE)
      {
      return cmTarget::GetTargetTypeName(this->GetType());
      }
    else if(prop == propINCLUDE_DIRECTORIES)
      {
      if (this->Internal->IncludeDirectoriesEntries.empty())
        {
        return 0;
        }

      static std::string output;
      MakePropertyList(output, this->Internal->IncludeDirectoriesEntries);
      return output.c_str();
      }
    else if(prop == propCOMPILE_FEATURES)
      {
      if (this->Internal->CompileFeaturesEntries.empty())
        {
        return 0;
        }

      static std::string output;
      MakePropertyList(output, this->Internal->CompileFeaturesEntries);
      return output.c_str();
      }
    else if(prop == propCOMPILE_OPTIONS)
      {
      if (this->Internal->CompileOptionsEntries.empty())
        {
        return 0;
        }

      static std::string output;
      MakePropertyList(output, this->Internal->CompileOptionsEntries);
      return output.c_str();
      }
    else if(prop == propCOMPILE_DEFINITIONS)
      {
      if (this->Internal->CompileDefinitionsEntries.empty())
        {
        return 0;
        }

      static std::string output;
      MakePropertyList(output, this->Internal->CompileDefinitionsEntries);
      return output.c_str();
      }
    else if (prop == propIMPORTED)
      {
      return this->IsImported()?"TRUE":"FALSE";
      }
    else if (prop == propNAME)
      {
      return this->GetName().c_str();
      }
    else if(prop == propSOURCES)
      {
      if (this->Internal->SourceEntries.empty())
        {
        return 0;
        }

      std::ostringstream ss;
      const char* sep = "";
      typedef cmTargetInternals::TargetPropertyEntry
                                  TargetPropertyEntry;
      for(std::vector<TargetPropertyEntry*>::const_iterator
            i = this->Internal->SourceEntries.begin();
          i != this->Internal->SourceEntries.end(); ++i)
        {
        std::string entry = (*i)->ge->GetInput();

        std::vector<std::string> files;
        cmSystemTools::ExpandListArgument(entry, files);
        for (std::vector<std::string>::const_iterator
            li = files.begin(); li != files.end(); ++li)
          {
          if(cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
              (*li)[li->size() - 1] == '>')
            {
            std::string objLibName = li->substr(17, li->size()-18);

            if (cmGeneratorExpression::Find(objLibName) != std::string::npos)
              {
              ss << sep;
              sep = ";";
              ss << *li;
              continue;
              }

            bool addContent = false;
            bool noMessage = true;
            std::ostringstream e;
            cmake::MessageType messageType = cmake::AUTHOR_WARNING;
            switch(context->GetPolicyStatus(cmPolicies::CMP0051))
              {
              case cmPolicies::WARN:
                e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
                noMessage = false;
              case cmPolicies::OLD:
                break;
              case cmPolicies::REQUIRED_ALWAYS:
              case cmPolicies::REQUIRED_IF_USED:
              case cmPolicies::NEW:
                addContent = true;
              }
            if (!noMessage)
              {
              e << "Target \"" << this->Name << "\" contains "
              "$<TARGET_OBJECTS> generator expression in its sources list.  "
              "This content was not previously part of the SOURCES property "
              "when that property was read at configure time.  Code reading "
              "that property needs to be adapted to ignore the generator "
              "expression using the string(GENEX_STRIP) command.";
              context->IssueMessage(messageType, e.str());
              }
            if (addContent)
              {
              ss << sep;
              sep = ";";
              ss << *li;
              }
            }
          else if (cmGeneratorExpression::Find(*li) == std::string::npos)
            {
            ss << sep;
            sep = ";";
            ss << *li;
            }
          else
            {
            cmSourceFile *sf = this->Makefile->GetOrCreateSource(*li);
            // Construct what is known about this source file location.
            cmSourceFileLocation const& location = sf->GetLocation();
            std::string sname = location.GetDirectory();
            if(!sname.empty())
              {
              sname += "/";
              }
            sname += location.GetName();

            ss << sep;
            sep = ";";
            // Append this list entry.
            ss << sname;
            }
          }
        }
      this->Properties.SetProperty("SOURCES", ss.str().c_str());
      }
    }

  const char *retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal)
    {
    const bool chain = this->GetMakefile()->GetState()->
                      IsPropertyChained(prop, cmProperty::TARGET);
    if (chain)
      {
      return this->Makefile->GetProperty(prop, chain);
      }
    }
  return retVal;
}